

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

uint8_t * WebPIDecGetYUVA(WebPIDecoder *idec,int *last_y,uint8_t **u,uint8_t **v,uint8_t **a,
                         int *width,int *height,int *stride,int *uv_stride,int *a_stride)

{
  WebPDecBuffer *pWVar1;
  size_t *in_RCX;
  undefined8 *in_RDX;
  int *in_RSI;
  WebPIDecoder *in_RDI;
  undefined8 *in_R8;
  int *in_R9;
  WebPDecBuffer *src;
  uint8_t *local_8;
  
  pWVar1 = GetOutputBuffer(in_RDI);
  if (pWVar1 == (WebPDecBuffer *)0x0) {
    local_8 = (uint8_t *)0x0;
  }
  else if (pWVar1->colorspace < MODE_YUV) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    if (in_RSI != (int *)0x0) {
      *in_RSI = (in_RDI->params).last_y;
    }
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = (pWVar1->u).YUVA.u;
    }
    if (in_RCX != (size_t *)0x0) {
      *in_RCX = (pWVar1->u).RGBA.size;
    }
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = (pWVar1->u).YUVA.a;
    }
    if (in_R9 != (int *)0x0) {
      *in_R9 = pWVar1->width;
    }
    if (src != (WebPDecBuffer *)0x0) {
      src->colorspace = pWVar1->height;
    }
    if (width != (int *)0x0) {
      *width = (pWVar1->u).YUVA.y_stride;
    }
    if (a != (uint8_t **)0x0) {
      *(int *)a = (pWVar1->u).YUVA.u_stride;
    }
    if (v != (uint8_t **)0x0) {
      *(int *)v = (pWVar1->u).YUVA.a_stride;
    }
    local_8 = (pWVar1->u).RGBA.rgba;
  }
  return local_8;
}

Assistant:

WEBP_NODISCARD uint8_t* WebPIDecGetYUVA(const WebPIDecoder* idec, int* last_y,
                                        uint8_t** u, uint8_t** v, uint8_t** a,
                                        int* width, int* height, int* stride,
                                        int* uv_stride, int* a_stride) {
  const WebPDecBuffer* const src = GetOutputBuffer(idec);
  if (src == NULL) return NULL;
  if (src->colorspace < MODE_YUV) {
    return NULL;
  }

  if (last_y != NULL) *last_y = idec->params.last_y;
  if (u != NULL) *u = src->u.YUVA.u;
  if (v != NULL) *v = src->u.YUVA.v;
  if (a != NULL) *a = src->u.YUVA.a;
  if (width != NULL) *width = src->width;
  if (height != NULL) *height = src->height;
  if (stride != NULL) *stride = src->u.YUVA.y_stride;
  if (uv_stride != NULL) *uv_stride = src->u.YUVA.u_stride;
  if (a_stride != NULL) *a_stride = src->u.YUVA.a_stride;

  return src->u.YUVA.y;
}